

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestAbortInternal::Run(TestAbortInternal *this)

{
  Outputter *pOVar1;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> *in_RDX;
  string local_50;
  testinator local_30 [8];
  char *local_28;
  undefined4 local_20;
  
  this->m_runCalled = true;
  pOVar1 = (this->super_Test).m_op;
  local_28 = "Hello world ";
  local_20 = 0x2a;
  testinator::Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,int>>>
            (&local_50,local_30,in_RDX);
  (*pOVar1->_vptr_Outputter[5])(pOVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ((this->super_Test).m_registry)->m_abort = true;
  return true;
}

Assistant:

virtual bool Run()
  {
    m_runCalled = true;
    ABORT("Hello world " << 42);
    return true;
  }